

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::SimplifyRecurrentAddExpression
          (SENodeSimplifyImpl *this,SERecurrentNode *recurrent_expr)

{
  ScalarEvolutionAnalysis *pSVar1;
  Loop *pLVar2;
  pointer ppSVar3;
  uint32_t uVar4;
  SENodeSimplifyImpl *pSVar5;
  int iVar6;
  tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_> tVar7;
  SENode *node;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  _Var8;
  SENode *pSVar9;
  undefined4 extraout_var;
  long lVar10;
  pointer ppSVar11;
  SENode *local_60;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_58;
  ChildContainerType *local_50;
  SENode *local_48;
  SENodeSimplifyImpl *local_40;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_38;
  
  local_48 = this->node_;
  local_40 = this;
  tVar7.super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       operator_new(0x48);
  pSVar1 = (recurrent_expr->super_SENode).parent_analysis_;
  pLVar2 = recurrent_expr->loop_;
  *(undefined ***)
   tVar7.
   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
   super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       &PTR___cxa_pure_virtual_00951a38;
  *(long *)((long)tVar7.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar7.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)tVar7.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) = 0;
  *(ScalarEvolutionAnalysis **)
   ((long)tVar7.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = pSVar1;
  uVar4 = SENode::NumberOfNodes;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  *(uint32_t *)
   ((long)tVar7.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
       SENode::NumberOfNodes;
  *(undefined ***)
   tVar7.
   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
   super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_00951c48;
  *(Loop **)((long)tVar7.
                   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                   .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x40) =
       pLVar2;
  node = (SENode *)operator_new(0x30);
  node->_vptr_SENode = (_func_int **)&PTR___cxa_pure_virtual_00951a38;
  local_50 = &node->children_;
  (node->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (node->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (node->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node->parent_analysis_ = pSVar1;
  SENode::NumberOfNodes = uVar4 + 2;
  node->unique_id_ = SENode::NumberOfNodes;
  node->_vptr_SENode = (_func_int **)&PTR_GetType_00951db8;
  local_60 = recurrent_expr->offset_;
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                    ((node->children_).
                     super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (node->children_).
                     super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
            (local_50,(const_iterator)_Var8._M_current,&local_60);
  ppSVar3 = (local_48->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar11 = (local_48->children_).
                  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar5 = local_40, ppSVar11 != ppSVar3;
      ppSVar11 = ppSVar11 + 1) {
    pSVar9 = *ppSVar11;
    iVar6 = (**pSVar9->_vptr_SENode)(pSVar9);
    if (iVar6 != 1) {
      (*node->_vptr_SENode[3])(node,pSVar9);
    }
  }
  pSVar9 = ScalarEvolutionAnalysis::SimplifyExpression(local_40->analysis_,node);
  iVar6 = (**pSVar9->_vptr_SENode)(pSVar9);
  if (iVar6 == 6) {
    local_58._M_head_impl = node;
    local_60 = ScalarEvolutionAnalysis::GetCachedOrAdd
                         (pSVar5->analysis_,
                          (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                           *)&local_58);
    recurrent_expr->offset_ = local_60;
    iVar6 = (*(recurrent_expr->super_SENode)._vptr_SENode[4])(recurrent_expr);
    if (CONCAT44(extraout_var,iVar6) != 0) goto LAB_00610d33;
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      ((recurrent_expr->super_SENode).children_.
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (recurrent_expr->super_SENode).children_.
                       super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_60);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              (&(recurrent_expr->super_SENode).children_,(const_iterator)_Var8._M_current,&local_60)
    ;
    if (local_58._M_head_impl != (SENode *)0x0) {
      (*(local_58._M_head_impl)->_vptr_SENode[2])();
    }
    local_58._M_head_impl = (SENode *)0x0;
    node = (SENode *)0x0;
  }
  else {
    *(SENode **)
     ((long)tVar7.
            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x38) = pSVar9;
    local_60 = pSVar9;
    lVar10 = (**(code **)(*(long *)tVar7.
                                   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                   .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                   _M_head_impl + 0x20))
                       (tVar7.
                        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl);
    if (lVar10 != 0) goto LAB_00610d33;
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      (*(long *)((long)tVar7.
                                       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                       .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                       _M_head_impl + 8),
                       *(long *)((long)tVar7.
                                       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                       .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                       _M_head_impl + 0x10),local_60);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               ((long)tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8),
               (const_iterator)_Var8._M_current,&local_60);
  }
  local_60 = recurrent_expr->coefficient_;
  *(SENode **)
   ((long)tVar7.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x30) = local_60;
  lVar10 = (**(code **)(*(long *)tVar7.
                                 super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                 .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl
                       + 0x20))
                     (tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl);
  if (lVar10 == 0) {
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                      (*(long *)((long)tVar7.
                                       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                       .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                       _M_head_impl + 8),
                       *(long *)((long)tVar7.
                                       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                       .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                       _M_head_impl + 0x10),local_60);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               ((long)tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8),
               (const_iterator)_Var8._M_current,&local_60);
    local_38._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
    super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         tVar7.
         super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
         .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
    pSVar9 = ScalarEvolutionAnalysis::GetCachedOrAdd
                       (pSVar5->analysis_,
                        (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                         *)&local_38);
    if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl != (SENode *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl +
                  0x10))();
    }
    local_38._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
    super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)0x0
    ;
    if (node != (SENode *)0x0) {
      (*node->_vptr_SENode[2])(node);
    }
    return pSVar9;
  }
LAB_00610d33:
  __assert_fail("false && \"Trying to add a child node to a constant!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
}

Assistant:

SENode* SENodeSimplifyImpl::SimplifyRecurrentAddExpression(
    SERecurrentNode* recurrent_expr) {
  const std::vector<SENode*>& children = node_->GetChildren();

  std::unique_ptr<SERecurrentNode> recurrent_node{new SERecurrentNode(
      recurrent_expr->GetParentAnalysis(), recurrent_expr->GetLoop())};

  // Create and simplify the new offset node.
  std::unique_ptr<SENode> new_offset{
      new SEAddNode(recurrent_expr->GetParentAnalysis())};
  new_offset->AddChild(recurrent_expr->GetOffset());

  for (SENode* child : children) {
    if (child->GetType() != SENode::RecurrentAddExpr) {
      new_offset->AddChild(child);
    }
  }

  // Simplify the new offset.
  SENode* simplified_child = analysis_.SimplifyExpression(new_offset.get());

  // If the child can be simplified, add the simplified form otherwise, add it
  // via the usual caching mechanism.
  if (simplified_child->GetType() != SENode::CanNotCompute) {
    recurrent_node->AddOffset(simplified_child);
  } else {
    recurrent_expr->AddOffset(analysis_.GetCachedOrAdd(std::move(new_offset)));
  }

  recurrent_node->AddCoefficient(recurrent_expr->GetCoefficient());

  return analysis_.GetCachedOrAdd(std::move(recurrent_node));
}